

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plugin.pb.cc
# Opt level: O3

void __thiscall
google::protobuf::compiler::CodeGeneratorRequest::SharedDtor(CodeGeneratorRequest *this)

{
  ulong uVar1;
  Version *this_00;
  undefined8 *puVar2;
  LogMessage *other;
  LogFinisher local_49;
  LogMessage local_48;
  
  uVar1 = (this->super_Message).super_MessageLite._internal_metadata_.ptr_;
  puVar2 = (undefined8 *)(uVar1 & 0xfffffffffffffffc);
  if ((uVar1 & 1) != 0) {
    puVar2 = (undefined8 *)*puVar2;
  }
  if (puVar2 != (undefined8 *)0x0) {
    internal::LogMessage::LogMessage
              (&local_48,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/deps/protobuf/src/google/protobuf/compiler/plugin.pb.cc"
               ,0x261);
    other = internal::LogMessage::operator<<
                      (&local_48,"CHECK failed: GetArenaForAllocation() == nullptr: ");
    internal::LogFinisher::operator=(&local_49,other);
    internal::LogMessage::~LogMessage(&local_48);
  }
  if ((undefined8 *)(this->parameter_).tagged_ptr_.ptr_ !=
      &internal::fixed_address_empty_string_abi_cxx11_) {
    internal::ArenaStringPtr::DestroyNoArenaSlowPath(&this->parameter_);
  }
  if (this != (CodeGeneratorRequest *)_CodeGeneratorRequest_default_instance_) {
    this_00 = this->compiler_version_;
    if (this_00 != (Version *)0x0) {
      Version::~Version(this_00);
    }
    operator_delete(this_00);
  }
  return;
}

Assistant:

inline void CodeGeneratorRequest::SharedDtor() {
  GOOGLE_DCHECK(GetArenaForAllocation() == nullptr);
  parameter_.DestroyNoArena(&::PROTOBUF_NAMESPACE_ID::internal::GetEmptyStringAlreadyInited());
  if (this != internal_default_instance()) delete compiler_version_;
}